

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O3

disp_binding_activator_t * __thiscall
so_5::env_infrastructures::st_reusable_stuff::
default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>_>
::bind_agent(disp_binding_activator_t *__return_storage_ptr__,
            default_disp_binder_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>_>
            *this,environment_t *param_1,agent_ref_t *agent)

{
  atomic<unsigned_long> *paVar1;
  agent_t *paVar2;
  long *plVar3;
  
  paVar2 = agent->m_obj;
  if (paVar2 != (agent_t *)0x0) {
    LOCK();
    (paVar2->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>._M_i =
         (paVar2->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>._M_i +
         1;
    UNLOCK();
  }
  LOCK();
  paVar1 = &((this->m_actual_disp).m_ptr)->m_agents_bound;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  plVar3 = (long *)operator_new(0x10);
  *plVar3 = (long)paVar2;
  *(long **)&(__return_storage_ptr__->super__Function_base)._M_functor = plVar3;
  plVar3[1] = (long)this;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/rt/impl/h/st_env_infrastructure_reuse.hpp:297:19)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/rt/impl/h/st_env_infrastructure_reuse.hpp:297:19)>
       ::_M_manager;
  return __return_storage_ptr__;
}

Assistant:

virtual disp_binding_activator_t
		bind_agent(
			environment_t & /*env*/,
			agent_ref_t agent ) override
			{
				auto result = [agent, this]() {
					agent->so_bind_to_dispatcher( m_actual_disp.get().event_queue() );
				};

				// Dispatcher must know about yet another agent bound.
				m_actual_disp.get().agent_bound();

				return result;
			}